

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue JVar1;
  JSValue new_target;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  ulong uVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  int64_t iVar10;
  JSValue v;
  JSValue JVar11;
  JSValue JVar12;
  JSValue v_00;
  JSValue JVar13;
  JSValue this_obj;
  int64_t len;
  JSValueUnion local_d8;
  ulong local_c0;
  int64_t local_a0;
  void *local_70;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion JVar6;
  
  JVar12 = JS_ToObject(ctx,this_val);
  JVar3 = JVar12.u;
  iVar2 = js_get_length64(ctx,(int64_t *)&local_70,JVar12);
  iVar9 = 3;
  if (iVar2 == 0) {
    JVar11 = *argv;
    iVar2 = check_function(ctx,*argv);
    if (iVar2 == 0) {
      if (argc < 2) {
        local_a0 = 3;
        uVar4 = 0;
        local_c0 = 0;
      }
      else {
        local_a0 = argv[1].tag;
        local_c0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
        uVar4 = (ulong)argv[1].u.ptr & 0xffffffff;
      }
      if (0 < (long)local_70) {
        JVar5.float64 = 0.0;
        do {
          JVar8.float64 = (double)JVar5.float64;
          if (JVar5.ptr < (void *)0x80000000) {
            JVar8 = JVar5;
          }
          iVar10 = 7;
          if (JVar5.ptr < (void *)0x80000000) {
            iVar10 = 0;
          }
          JVar1.tag = iVar10;
          JVar1.u.float64 = JVar8.float64;
          JVar13.tag = iVar10;
          JVar13.u.float64 = JVar8.float64;
          v_00 = JS_GetPropertyValue(ctx,JVar12,JVar13);
          iVar9 = v_00.tag;
          JVar6 = v_00.u;
          if ((uint)v_00.tag == 6) {
LAB_00166002:
            uVar7 = (ulong)JVar6.ptr & 0xffffffff00000000;
            uVar4 = (ulong)JVar6.ptr & 0xffffffff;
            goto LAB_00165d74;
          }
          local_d8.float64 = local_d8.float64 & 0xffffffff00000000;
          new_target.tag = 3;
          new_target.u.ptr = local_d8.ptr;
          this_obj.tag = local_a0;
          this_obj.u.ptr = (void *)(local_c0 | uVar4);
          local_68 = v_00;
          local_58 = JVar8;
          local_50 = iVar10;
          local_48 = this_val.u;
          local_40 = this_val.tag;
          JVar13 = JS_CallInternal(ctx,JVar11,this_obj,new_target,3,&local_68,2);
          if ((int)JVar13.tag == 6) goto LAB_00166002;
          iVar2 = JS_ToBoolFree(ctx,JVar13);
          if (iVar2 != 0) {
            if (findIndex == 0) {
              JVar11.tag = iVar10;
              JVar11.u.float64 = JVar8.float64;
              JS_FreeValue(ctx,JVar11);
              JS_FreeValue(ctx,JVar12);
              JVar8.float64 = JVar6.float64 & 0xffffffff00000000;
            }
            else {
              JS_FreeValue(ctx,v_00);
              JS_FreeValue(ctx,JVar12);
              JVar8.float64 = JVar8.float64 & 0x7fffffff00000000;
              v_00 = JVar1;
            }
            goto LAB_00165ddb;
          }
          if ((0xfffffff4 < (uint)v_00.tag) &&
             (iVar2 = *JVar6.ptr, *(int *)JVar6.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          JVar5.float64 = JVar5.float64 + 1;
          local_d8 = JVar6;
        } while (local_70 != JVar5.ptr);
      }
      if ((0xfffffff4 < (uint)JVar12.tag) &&
         (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar12);
      }
      JVar8.float64 = 0.0;
      JVar3.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar3.float64 = JVar8.float64;
      }
      v_00.tag = (ulong)(findIndex == 0) * 3;
      v_00.u.float64 = JVar3.float64;
      goto LAB_00165ddb;
    }
  }
  uVar4 = 0;
  uVar7 = 0;
LAB_00165d74:
  JVar5.ptr = (void *)(uVar4 | uVar7);
  if ((0xfffffff4 < (uint)iVar9) && (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2))
  {
    v.tag = iVar9;
    v.u.ptr = JVar5.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  if ((0xfffffff4 < (uint)JVar12.tag) &&
     (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar12);
  }
  JVar8.float64 = 0.0;
  v_00 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00165ddb:
  JVar12.u.float64 = (ulong)v_00.u.ptr & 0xffffffff | JVar8.float64;
  JVar12.tag = v_00.tag;
  return JVar12;
}

Assistant:

static JSValue js_array_find(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue obj, val, index_val, res;
    int64_t len, k;

    index_val = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt64(ctx, k);
        if (JS_IsException(index_val))
            goto exception;
        val = JS_GetPropertyValue(ctx, obj, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                JS_FreeValue(ctx, obj);
                return index_val;
            } else {
                JS_FreeValue(ctx, index_val);
                JS_FreeValue(ctx, obj);
                return val;
            }
        }
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, index_val);
    }
    JS_FreeValue(ctx, obj);
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, index_val);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}